

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O2

void __thiscall yactfr::internal::TsdlParser::_parseMetadata(TsdlParser *this)

{
  string msg;
  string msg_00;
  TextLocation loc;
  TextLocation loc_00;
  bool bVar1;
  int __status;
  undefined8 uVar2;
  _LexicalScope lexScope;
  undefined8 in_stack_ffffffffffffff60;
  TsdlParser *pTVar3;
  Kind KVar4;
  undefined4 in_stack_ffffffffffffff74;
  Index in_stack_ffffffffffffff78;
  string local_68 [32];
  string local_48 [32];
  TextLocation local_28;
  
  KVar4 = Root;
  uVar2 = 0;
  pTVar3 = this;
  _stackPush(this,Root);
  do {
    bVar1 = _tryParseRootBlock(this);
    __status = (int)uVar2;
  } while (bVar1);
  _skipCommentsAndWhitespacesAndSemicolons(this);
  if ((this->_ss)._at == (this->_ss)._end) {
    if ((this->_pseudoTraceType).super_type.m_initialized != false) {
      _createTraceType(this);
      _LexicalScope::exit((_LexicalScope *)&stack0xffffffffffffff68,__status);
      return;
    }
    std::__cxx11::string::string
              (local_68,"Missing `trace` block.",(allocator *)&stack0xffffffffffffff67);
    msg_00.field_2._M_allocated_capacity = 0;
    msg_00._M_dataplus._M_p = (pointer)0x0;
    msg_00._M_string_length = 0;
    msg_00.field_2._8_8_ = in_stack_ffffffffffffff60;
    loc_00._lineNumber._0_4_ = KVar4;
    loc_00._offset = (Index)pTVar3;
    loc_00._lineNumber._4_4_ = in_stack_ffffffffffffff74;
    loc_00._colNumber = 0;
    throwTextParseError(msg_00,loc_00);
  }
  std::__cxx11::string::string
            (local_48,
             "Expecting data type alias (`typealias`, `typedef`, `enum NAME`, `struct NAME`, or `variant NAME`), trace type block (`trace`), trace environment block (`env`), clock type block (`clock`), data stream type block (`stream`), or event record type block (`event`). Did you forget the `;` after the closing `}` of the block?"
             ,(allocator *)&stack0xffffffffffffff67);
  StrScanner::loc(&local_28,&this->_ss);
  msg._M_string_length = local_28._lineNumber;
  msg._M_dataplus._M_p = (pointer)local_28._offset;
  msg.field_2._M_allocated_capacity = local_28._colNumber;
  msg.field_2._8_8_ = in_stack_ffffffffffffff60;
  loc._lineNumber._0_4_ = KVar4;
  loc._offset = (Index)pTVar3;
  loc._lineNumber._4_4_ = in_stack_ffffffffffffff74;
  loc._colNumber = in_stack_ffffffffffffff78;
  throwTextParseError(msg,loc);
}

Assistant:

void TsdlParser::_parseMetadata()
{
    _LexicalScope lexScope {*this, _tStackFrame::Kind::Root};

    while (this->_tryParseRootBlock());

    // make sure we skip the remaining fruitless stuff
    this->_skipCommentsAndWhitespacesAndSemicolons();

    if (!_ss.isDone()) {
        throwTextParseError("Expecting data type alias (`typealias`, `typedef`, `enum NAME`, "
                            "`struct NAME`, or `variant NAME`), trace type block (`trace`), "
                            "trace environment block (`env`), "
                            "clock type block (`clock`), data stream type block (`stream`), "
                            "or event record type block (`event`). Did you forget the `;` "
                            "after the closing `}` of the block?",
                            _ss.loc());
    }

    if (!_pseudoTraceType) {
        throwTextParseError("Missing `trace` block.");
    }

    // create a yactfr trace type from the pseudo trace type
    this->_createTraceType();
}